

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_bfext_reg(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx_00;
  TCGv_i32 ret;
  uint16_t uVar1;
  uint value;
  uint32_t uVar2;
  uint len_00;
  TCGv_i32 ret_00;
  TCGv_i32 ret_01;
  TCGv_i32 shift;
  TCGv_i32 tmp;
  int pos;
  int ofs;
  int len;
  TCGv_i32 dst;
  TCGv_i32 src;
  int is_sign;
  int ext;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  uVar1 = read_im16(env,s);
  value = (uint)uVar1;
  dst = tcg_ctx_00->cpu_dregs[(int)(insn & 7)];
  ret = tcg_ctx_00->cpu_dregs[(int)((int)value >> 0xc & 7)];
  uVar2 = extract32(value,0,5);
  len_00 = (uVar2 - 1 & 0x1f) + 1;
  uVar2 = extract32(value,6,5);
  tmp._4_4_ = (0x20 - uVar2) - len_00;
  ret_00 = tcg_temp_new_i32(tcg_ctx_00);
  if ((uVar1 & 0x20) == 0) {
    if ((uVar1 & 0x800) == 0) {
      if ((int)tmp._4_4_ < 0) {
        tcg_gen_rotli_i32_m68k(tcg_ctx_00,ret_00,dst,uVar2);
        tmp._4_4_ = 0x20 - len_00;
        dst = ret_00;
      }
    }
    else {
      tcg_gen_andi_i32_m68k
                (tcg_ctx_00,ret_00,tcg_ctx_00->cpu_dregs[(int)((int)value >> 6 & 7)],0x1f);
      tcg_gen_rotl_i32_m68k(tcg_ctx_00,ret_00,dst,ret_00);
      tmp._4_4_ = 0x20 - len_00;
      dst = ret_00;
    }
    tcg_gen_sextract_i32_m68k(tcg_ctx_00,QREG_CC_N,dst,tmp._4_4_,len_00);
    if ((insn & 0x200) == 0) {
      tcg_gen_extract_i32_m68k(tcg_ctx_00,ret,dst,tmp._4_4_,len_00);
    }
    else {
      tcg_gen_mov_i32(tcg_ctx_00,ret,QREG_CC_N);
    }
  }
  else {
    if ((uVar1 & 0x800) == 0) {
      tcg_gen_rotli_i32_m68k(tcg_ctx_00,ret_00,dst,uVar2);
    }
    else {
      tcg_gen_andi_i32_m68k
                (tcg_ctx_00,ret_00,tcg_ctx_00->cpu_dregs[(int)((int)value >> 6 & 7)],0x1f);
      tcg_gen_rotl_i32_m68k(tcg_ctx_00,ret_00,dst,ret_00);
    }
    ret_01 = tcg_temp_new_i32(tcg_ctx_00);
    tcg_gen_neg_i32(tcg_ctx_00,ret_01,tcg_ctx_00->cpu_dregs[(int)(value & 7)]);
    tcg_gen_andi_i32_m68k(tcg_ctx_00,ret_01,ret_01,0x1f);
    tcg_gen_sar_i32(tcg_ctx_00,QREG_CC_N,ret_00,ret_01);
    if ((insn & 0x200) == 0) {
      tcg_gen_shr_i32(tcg_ctx_00,ret,ret_00,ret_01);
    }
    else {
      tcg_gen_mov_i32(tcg_ctx_00,ret,QREG_CC_N);
    }
    tcg_temp_free_i32(tcg_ctx_00,ret_01);
  }
  tcg_temp_free_i32(tcg_ctx_00,ret_00);
  set_cc_op(s,CC_OP_LOGIC);
  return;
}

Assistant:

DISAS_INSN(bfext_reg)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int ext = read_im16(env, s);
    int is_sign = insn & 0x200;
    TCGv src = DREG(insn, 0);
    TCGv dst = DREG(ext, 12);
    int len = ((extract32(ext, 0, 5) - 1) & 31) + 1;
    int ofs = extract32(ext, 6, 5);  /* big bit-endian */
    int pos = 32 - ofs - len;        /* little bit-endian */
    TCGv tmp = tcg_temp_new(tcg_ctx);
    TCGv shift;

    /*
     * In general, we're going to rotate the field so that it's at the
     * top of the word and then right-shift by the complement of the
     * width to extend the field.
     */
    if (ext & 0x20) {
        /* Variable width.  */
        if (ext & 0x800) {
            /* Variable offset.  */
            tcg_gen_andi_i32(tcg_ctx, tmp, DREG(ext, 6), 31);
            tcg_gen_rotl_i32(tcg_ctx, tmp, src, tmp);
        } else {
            tcg_gen_rotli_i32(tcg_ctx, tmp, src, ofs);
        }

        shift = tcg_temp_new(tcg_ctx);
        tcg_gen_neg_i32(tcg_ctx, shift, DREG(ext, 0));
        tcg_gen_andi_i32(tcg_ctx, shift, shift, 31);
        tcg_gen_sar_i32(tcg_ctx, QREG_CC_N, tmp, shift);
        if (is_sign) {
            tcg_gen_mov_i32(tcg_ctx, dst, QREG_CC_N);
        } else {
            tcg_gen_shr_i32(tcg_ctx, dst, tmp, shift);
        }
        tcg_temp_free(tcg_ctx, shift);
    } else {
        /* Immediate width.  */
        if (ext & 0x800) {
            /* Variable offset */
            tcg_gen_andi_i32(tcg_ctx, tmp, DREG(ext, 6), 31);
            tcg_gen_rotl_i32(tcg_ctx, tmp, src, tmp);
            src = tmp;
            pos = 32 - len;
        } else {
            /*
             * Immediate offset.  If the field doesn't wrap around the
             * end of the word, rely on (s)extract completely.
             */
            if (pos < 0) {
                tcg_gen_rotli_i32(tcg_ctx, tmp, src, ofs);
                src = tmp;
                pos = 32 - len;
            }
        }

        tcg_gen_sextract_i32(tcg_ctx, QREG_CC_N, src, pos, len);
        if (is_sign) {
            tcg_gen_mov_i32(tcg_ctx, dst, QREG_CC_N);
        } else {
            tcg_gen_extract_i32(tcg_ctx, dst, src, pos, len);
        }
    }

    tcg_temp_free(tcg_ctx, tmp);
    set_cc_op(s, CC_OP_LOGIC);
}